

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pNode;
  Vec_Int_t *pVVar2;
  int iVar3;
  char *__assertion;
  long lVar4;
  
  iVar3 = (pObj->vFanins).nSize;
  if ((iVar3 != 0) && ((iVar3 != 1 || ((*(uint *)&pObj->field_0x14 & 0xf) != 7)))) {
    __assert_fail("Abc_ObjFaninNum(pObj) == 0 || Abc_SclObjIsBufInv(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x146,"void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *)");
  }
  if (0 < (pObj->vFanouts).nSize) {
    lVar4 = 0;
    do {
      pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]];
      iVar3 = (pNode->vFanins).nSize;
      if (iVar3 < 1) {
        __assert_fail("Abc_ObjFaninNum(pFanout) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                      ,0x149,"void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *)");
      }
      if ((iVar3 == 1) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NodeInvUpdateFanPolarity(pNode);
      }
      else {
        iVar3 = Abc_NodeFindFanin(pNode,pObj);
        pVVar2 = pNode->pNtk->vPhases;
        if (pVVar2 == (Vec_Int_t *)0x0) {
          __assertion = "p->pNtk->vPhases";
LAB_0045284e:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x18b,"void Abc_ObjFaninFlipPhase(Abc_Obj_t *, int)");
        }
        if ((iVar3 < 0) || ((pNode->vFanins).nSize <= iVar3)) {
          __assertion = "i >= 0 && i < Abc_ObjFaninNum(p)";
          goto LAB_0045284e;
        }
        iVar1 = pNode->Id;
        if (((long)iVar1 < 0) || (pVVar2->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        pVVar2->pArray[iVar1] = pVVar2->pArray[iVar1] ^ 1 << ((byte)iVar3 & 0x1f);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pObj->vFanouts).nSize);
  }
  return;
}

Assistant:

void Abc_NodeInvUpdateFanPolarity( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjFaninNum(pObj) == 0 || Abc_SclObjIsBufInv(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        assert( Abc_ObjFaninNum(pFanout) > 0 );
        if ( Abc_SclObjIsBufInv(pFanout) )
            Abc_NodeInvUpdateFanPolarity( pFanout );
        else
            Abc_ObjFaninFlipPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) );
    }
}